

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  byte bVar1;
  uint uVar2;
  pointer puVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined3 in_register_00000089;
  uint8_t *imageX;
  uchar *puVar8;
  iterator data;
  pointer __s;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  bVar1 = image->_colorCount;
  uVar6 = width * bVar1;
  uVar2 = height;
  if (CONCAT31(in_register_00000089,horizontal) != 0) {
    uVar2 = uVar6;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(projection,(ulong)uVar2);
  __s = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar3 = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar3) {
    memset(__s,0,((long)puVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  uVar2 = image->_rowSize;
  puVar8 = image->_data + (ulong)(bVar1 * x) + (ulong)(y * uVar2);
  if (horizontal) {
    if (uVar6 != 0) {
      puVar4 = puVar8 + uVar6;
      do {
        if ((ulong)(height * uVar2) != 0) {
          uVar6 = *__s;
          uVar7 = 0;
          do {
            uVar6 = uVar6 + puVar8[uVar7];
            *__s = uVar6;
            uVar7 = uVar7 + uVar2;
          } while (height * uVar2 != uVar7);
        }
        puVar8 = puVar8 + 1;
        __s = __s + 1;
      } while (puVar8 != puVar4);
    }
  }
  else if (height * uVar2 != 0) {
    puVar4 = puVar8 + height * uVar2;
    do {
      if (uVar6 != 0) {
        uVar5 = *__s;
        uVar7 = 0;
        do {
          uVar5 = uVar5 + puVar8[uVar7];
          *__s = uVar5;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      puVar8 = puVar8 + uVar2;
      __s = __s + 1;
    } while (puVar8 != puVar4);
  }
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();

        projection.resize( horizontal ? width * colorCount : height );
        std::fill( projection.begin(), projection.end(), 0u );

        const uint32_t rowSize = image.rowSize();

        width = width * colorCount;

        if( horizontal ) {
            const uint8_t * imageX = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageX != imageXEnd; ++imageX, ++data ) {
                const uint8_t * imageY    = imageX;
                const uint8_t * imageYEnd = imageY + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize )
                    (*data) += (*imageY);
            }
        }
        else {
            const uint8_t * imageY = image.data() + y * rowSize + x * colorCount;
            const uint8_t * imageYEnd = imageY + height * rowSize;

            std::vector < uint32_t > ::iterator data = projection.begin();

            for( ; imageY != imageYEnd; imageY += rowSize, ++data ) {
                const uint8_t * imageX    = imageY;
                const uint8_t * imageXEnd = imageX + width;

                for( ; imageX != imageXEnd; ++imageX )
                    (*data) += (*imageX);
            }
        }
    }